

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O3

int __thiscall clunk::Node::QSearch<true>(Node *this,int alpha,int beta,int depth)

{
  HashEntry *this_00;
  Move *this_01;
  uint uVar1;
  Move MVar2;
  Node *pNVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  Move *pMVar9;
  uint uVar10;
  Move *pMVar11;
  Move *pMVar12;
  int iVar13;
  int iVar14;
  
  if (beta <= alpha) {
    __assert_fail("alpha < beta",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xeff,"int clunk::Node::QSearch(int, int, const int) [color = true]");
  }
  uVar10 = -alpha;
  if (0 < alpha) {
    uVar10 = alpha;
  }
  if (32000 < uVar10) {
    __assert_fail("abs(alpha) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf00,"int clunk::Node::QSearch(int, int, const int) [color = true]");
  }
  uVar10 = -beta;
  if (0 < beta) {
    uVar10 = beta;
  }
  if (32000 < uVar10) {
    __assert_fail("abs(beta) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf01,"int clunk::Node::QSearch(int, int, const int) [color = true]");
  }
  if (0 < depth) {
    __assert_fail("depth <= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf02,"int clunk::Node::QSearch(int, int, const int) [color = true]");
  }
  _stats._56_8_ = _stats._56_8_ + 1;
  if (_seldepth < this->ply) {
    _seldepth = this->ply;
  }
  this->depthChange = 0;
  this->pvCount = 0;
  if ((99 < this->rcount || (this->state & 0x20U) != 0) || (bVar4 = HasRepeated(this), bVar4)) {
switchD_00135488_caseD_2:
    iVar13 = DAT_0017da54;
    this->standPat = DAT_0017da54;
  }
  else {
    iVar6 = this->ply;
    iVar13 = iVar6 + -32000;
    if (alpha < iVar13) {
      alpha = iVar13;
    }
    iVar5 = 0x7d01 - iVar6;
    if (beta <= 0x7d01 - iVar6) {
      iVar5 = beta;
    }
    if (this->child == (Node *)0x0 || iVar5 <= alpha) {
      return alpha;
    }
    if (_tt._32_8_ == 0) {
      __assert_fail("keyMask",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                    ,0xf7,
                    "EntryType *clunk::TranspositionTable<clunk::HashEntry>::Get(const uint64_t) [EntryType = clunk::HashEntry]"
                   );
    }
    if (_tt._40_8_ == 0) {
      __assert_fail("entries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                    ,0xf8,
                    "EntryType *clunk::TranspositionTable<clunk::HashEntry>::Get(const uint64_t) [EntryType = clunk::HashEntry]"
                   );
    }
    _tt._0_8_ = _tt._0_8_ + 1;
    lVar7 = (_tt._32_8_ & this->positionKey) * 0x10;
    this_00 = (HashEntry *)(_tt._40_8_ + lVar7);
    if (*(ulong *)(_tt._40_8_ + lVar7) == this->positionKey) {
      _tt._8_8_ = _tt._8_8_ + 1;
      switch(this_00->flags & 7) {
      case 1:
        goto switchD_00135488_caseD_1;
      case 2:
        goto switchD_00135488_caseD_2;
      case 3:
        iVar6 = HashEntry::Score(this_00,iVar6);
        if (iVar6 <= alpha) {
          return iVar6;
        }
        break;
      case 4:
        iVar13 = HashEntry::Score(this_00,iVar6);
        return iVar13;
      case 5:
        iVar6 = HashEntry::Score(this_00,iVar6);
        if (iVar5 <= iVar6) {
          return iVar6;
        }
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf2d,"int clunk::Node::QSearch(int, int, const int) [color = true]");
      }
    }
    if (this->pvCount != 0) {
      __assert_fail("!pvCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xf33,"int clunk::Node::QSearch(int, int, const int) [color = true]");
    }
    if (this->checks == 0) {
      Evaluate(this);
      iVar13 = this->standPat;
      if (iVar5 <= iVar13) {
        return iVar13;
      }
      if (alpha <= iVar13) {
        alpha = iVar13;
      }
    }
    GenerateMoves<true,true>(this,depth);
    if (this->moveCount < 1) {
      if (this->checks == 0) {
        iVar13 = this->standPat;
      }
      else {
        if (this->positionKey == 0) {
          __assert_fail("entryKey",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                        ,0x7b,"void clunk::HashEntry::SetCheckmate(const uint64_t)");
        }
        this_00->key = this->positionKey;
        this_00->moveBits = 0;
        this_00->depth = '\0';
        this_00->flags = '\x01';
        this_00->score = 32000;
        _tt._16_8_ = _tt._16_8_ + 1;
        iVar13 = this->ply + -32000;
      }
    }
    else {
      while( true ) {
        uVar10 = this->moveIndex;
        if ((int)uVar10 < 0) {
          __assert_fail("moveIndex >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x914,"Move *clunk::Node::GetNextMove()");
        }
        uVar1 = this->moveCount;
        if (0x7f < uVar1) {
          __assert_fail("(moveCount >= 0) & (moveCount < MaxMoves)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x915,"Move *clunk::Node::GetNextMove()");
        }
        if (uVar1 <= uVar10) break;
        this_01 = this->moves + uVar10;
        uVar8 = uVar10 + 1;
        if (uVar8 < uVar1) {
          pMVar9 = this->moves + (ulong)uVar10 + 1;
          pMVar12 = this_01;
          uVar10 = uVar8;
          do {
            pMVar11 = pMVar9;
            if (pMVar9->score <= pMVar12->score) {
              pMVar11 = pMVar12;
            }
            uVar10 = uVar10 + 1;
            pMVar9 = pMVar9 + 1;
            pMVar12 = pMVar11;
          } while ((int)uVar10 < (int)uVar1);
          if (pMVar11 != this_01) {
            MVar2 = *this_01;
            *this_01 = *pMVar11;
            *pMVar11 = MVar2;
          }
        }
        this->moveIndex = uVar8;
        bVar4 = Move::IsValid(this_01);
        if (!bVar4) {
          __assert_fail("move->IsValid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xf50,"int clunk::Node::QSearch(int, int, const int) [color = true]");
        }
        if (alpha < iVar13) {
          __assert_fail("best <= alpha",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xf51,"int clunk::Node::QSearch(int, int, const int) [color = true]");
        }
        if (iVar5 <= alpha) {
          __assert_fail("alpha < beta",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xf52,"int clunk::Node::QSearch(int, int, const int) [color = true]");
        }
        _stats._96_8_ = _stats._96_8_ + 1;
        Exec<true>(this,this_01,this->child);
        iVar6 = QSearch<false>(this->child,-iVar5,-alpha,depth + -1);
        Undo<true>(this,this_01);
        if (_stop != 0) {
          return iVar5;
        }
        iVar14 = -iVar6;
        if (SBORROW4(iVar13,iVar14) != iVar13 + iVar6 < 0) {
          Move::operator=(this->pv,this_01);
          pNVar3 = this->child;
          if (pNVar3 == (Node *)0x0) {
            this->pvCount = 1;
          }
          else {
            uVar10 = pNVar3->pvCount;
            this->pvCount = uVar10 + 1;
            if (0 < (int)uVar10) {
              if (99 < uVar10) {
                __assert_fail("pvCount <= MaxPlies",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0xc50,"void clunk::Node::UpdatePV(const Move &)");
              }
              memcpy(this->pv + 1,pNVar3->pv,(long)pNVar3->pvCount << 3);
            }
          }
          if (iVar5 == iVar14 || SBORROW4(iVar5,iVar14) != iVar5 + iVar6 < 0) {
            return iVar14;
          }
          iVar13 = iVar14;
          if (alpha == iVar14 || SBORROW4(alpha,iVar14) != alpha + iVar6 < 0) {
            alpha = iVar14;
          }
        }
        if (iVar5 <= alpha) {
          __assert_fail("alpha < beta",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xf62,"int clunk::Node::QSearch(int, int, const int) [color = true]");
        }
      }
      if (alpha < iVar13) {
        __assert_fail("best <= alpha",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf65,"int clunk::Node::QSearch(int, int, const int) [color = true]");
      }
      if (iVar5 <= alpha) {
        __assert_fail("alpha < beta",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf66,"int clunk::Node::QSearch(int, int, const int) [color = true]");
      }
    }
  }
switchD_00135488_caseD_1:
  return iVar13;
}

Assistant:

int QSearch(int alpha, int beta, const int depth) {
    assert(alpha < beta);
    assert(abs(alpha) <= Infinity);
    assert(abs(beta) <= Infinity);
    assert(depth <= 0);

    _stats.qnodes++;
    if (ply > _seldepth) {
      _seldepth = ply;
    }

    pvCount = 0;
    depthChange = 0;

    if (IsDraw()) {
      return (standPat = _drawScore[color]);
    }

    // mate distance pruning
    int best = (ply - Infinity);
    alpha = std::max<int>(best, alpha);
    beta = std::min<int>((Infinity - ply + 1), beta);
    if ((alpha >= beta) | !child) {
      return alpha;
    }

    // transposition table lookup
    int score;
    HashEntry* entry = _tt.Get(positionKey);
    if (entry->Key() == positionKey) {
      _tt.IncHits();
      switch (entry->GetPrimaryFlag()) {
      case HashEntry::Checkmate: return (ply - Infinity);
      case HashEntry::Stalemate: return (standPat = _drawScore[color]);
      case HashEntry::UpperBound:
        if ((score = entry->Score(ply)) <= alpha) {
          return score;
        }
        break;
      case HashEntry::ExactScore:
        return entry->Score(ply);
      case HashEntry::LowerBound:
        if ((score = entry->Score(ply)) >= beta) {
          return score;
        }
        break;
      default:
        assert(false);
      }
    }

    assert(best <= alpha);
    assert(alpha < beta);
    assert(!pvCount);

    // if not in check allow standPat
    if (!checks) {
      Evaluate();
      if (standPat >= beta) {
        return standPat;
      }
      alpha = std::max<int>(alpha, standPat);
      best = standPat;
      assert(best <= alpha);
      assert(alpha < beta);
    }

    // generate moves
    GenerateMoves<color, true>(depth);
    if (moveCount <= 0) {
      if (checks) {
        entry->SetCheckmate(positionKey);
        _tt.IncCheckmates();
        return (ply - Infinity);
      }
      // don't call _tt.StoreStalemate()!!!
      return standPat;
    }

    // search 'em
    Move* move;
    while ((move = GetNextMove())) {
      assert(move->IsValid());
      assert(best <= alpha);
      assert(alpha < beta);
      _stats.qexecs++;
      Exec<color>(*move, *child);
      score = -child->QSearch<!color>(-beta, -alpha, (depth - 1));
      Undo<color>(*move);
      if (_stop) {
        return beta;
      }
      if (score > best) {
        UpdatePV(*move);
        if (score >= beta) {
          return score;
        }
        alpha = std::max<int>(alpha, score);
        best = score;
      }
      assert(alpha < beta);
    }

    assert(best <= alpha);
    assert(alpha < beta);
    return best;
  }